

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void exprCodeBetween(Parse *pParse,Expr *pExpr,int dest,int jumpIfTrue,int jumpIfNull)

{
  byte bVar1;
  ExprList_item *pEVar2;
  char cVar3;
  u16 uVar4;
  undefined4 uVar5;
  long lVar6;
  Expr *pEVar7;
  Expr *pEVar8;
  int regFree1;
  Expr exprAnd;
  Expr exprX;
  Expr compRight;
  Expr compLeft;
  int local_14c;
  Expr local_148;
  Expr local_100;
  Expr local_b8;
  Expr local_70;
  
  local_14c = 0;
  pEVar7 = pExpr->pLeft;
  pEVar8 = &local_100;
  for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
    cVar3 = pEVar7->affinity;
    uVar4 = pEVar7->flags;
    uVar5 = *(undefined4 *)&pEVar7->field_0x4;
    pEVar8->op = pEVar7->op;
    pEVar8->affinity = cVar3;
    pEVar8->flags = uVar4;
    *(undefined4 *)&pEVar8->field_0x4 = uVar5;
    pEVar7 = (Expr *)&pEVar7->u;
    pEVar8 = (Expr *)&pEVar8->u;
  }
  local_148.op = 'E';
  local_148.pLeft = &local_70;
  local_148.pRight = &local_b8;
  local_70.op = 'P';
  pEVar2 = ((pExpr->x).pList)->a;
  local_70.pRight = pEVar2->pExpr;
  local_b8.op = 'N';
  local_b8.pRight = pEVar2[1].pExpr;
  local_b8.pLeft = &local_100;
  local_70.pLeft = &local_100;
  local_100.iTable = sqlite3ExprCodeTemp(pParse,&local_100,&local_14c);
  local_100.op = 0x84;
  if (jumpIfTrue == 0) {
    sqlite3ExprIfFalse(pParse,&local_148,dest,jumpIfNull);
  }
  else {
    sqlite3ExprIfTrue(pParse,&local_148,dest,jumpIfNull);
  }
  if (local_14c != 0) {
    bVar1 = pParse->nTempReg;
    if ((ulong)bVar1 < 8) {
      lVar6 = 0;
      do {
        if (*(int *)((long)&pParse->aColCache[0].iReg + lVar6) == local_14c) {
          (&pParse->aColCache[0].tempReg)[lVar6] = '\x01';
          return;
        }
        lVar6 = lVar6 + 0x18;
      } while ((int)lVar6 != 0xf0);
      pParse->nTempReg = bVar1 + 1;
      pParse->aTempReg[bVar1] = local_14c;
    }
  }
  return;
}

Assistant:

static void exprCodeBetween(
  Parse *pParse,    /* Parsing and code generating context */
  Expr *pExpr,      /* The BETWEEN expression */
  int dest,         /* Jump here if the jump is taken */
  int jumpIfTrue,   /* Take the jump if the BETWEEN is true */
  int jumpIfNull    /* Take the jump if the BETWEEN is NULL */
){
  Expr exprAnd;     /* The AND operator in  x>=y AND x<=z  */
  Expr compLeft;    /* The  x>=y  term */
  Expr compRight;   /* The  x<=z  term */
  Expr exprX;       /* The  x  subexpression */
  int regFree1 = 0; /* Temporary use register */

  assert( !ExprHasProperty(pExpr, EP_xIsSelect) );
  exprX = *pExpr->pLeft;
  exprAnd.op = TK_AND;
  exprAnd.pLeft = &compLeft;
  exprAnd.pRight = &compRight;
  compLeft.op = TK_GE;
  compLeft.pLeft = &exprX;
  compLeft.pRight = pExpr->x.pList->a[0].pExpr;
  compRight.op = TK_LE;
  compRight.pLeft = &exprX;
  compRight.pRight = pExpr->x.pList->a[1].pExpr;
  exprX.iTable = sqlite3ExprCodeTemp(pParse, &exprX, &regFree1);
  exprX.op = TK_REGISTER;
  if( jumpIfTrue ){
    sqlite3ExprIfTrue(pParse, &exprAnd, dest, jumpIfNull);
  }else{
    sqlite3ExprIfFalse(pParse, &exprAnd, dest, jumpIfNull);
  }
  sqlite3ReleaseTempReg(pParse, regFree1);

  /* Ensure adequate test coverage */
  testcase( jumpIfTrue==0 && jumpIfNull==0 && regFree1==0 );
  testcase( jumpIfTrue==0 && jumpIfNull==0 && regFree1!=0 );
  testcase( jumpIfTrue==0 && jumpIfNull!=0 && regFree1==0 );
  testcase( jumpIfTrue==0 && jumpIfNull!=0 && regFree1!=0 );
  testcase( jumpIfTrue!=0 && jumpIfNull==0 && regFree1==0 );
  testcase( jumpIfTrue!=0 && jumpIfNull==0 && regFree1!=0 );
  testcase( jumpIfTrue!=0 && jumpIfNull!=0 && regFree1==0 );
  testcase( jumpIfTrue!=0 && jumpIfNull!=0 && regFree1!=0 );
}